

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

int Cudd_zddNextPath(DdGen *gen,int **path)

{
  DdManager *pDVar1;
  DdNode *pDVar2;
  uint *puVar3;
  bool bVar4;
  DdManager *zdd;
  DdNode *prev;
  DdNode *next;
  DdNode *top;
  int **path_local;
  DdGen *gen_local;
  
  pDVar1 = gen->manager;
  do {
    if ((gen->stack).sp == 1) {
      gen->status = 0;
      (gen->stack).sp = (gen->stack).sp + -1;
LAB_00c14b7d:
      bVar4 = gen->status != 0;
      if (bVar4) {
        *path = (gen->gen).cubes.cube;
      }
      gen_local._4_4_ = (uint)bVar4;
      return gen_local._4_4_;
    }
    puVar3 = (uint *)((ulong)(gen->stack).stack[(gen->stack).sp + -2] & 0xfffffffffffffffe);
    pDVar2 = *(DdNode **)(puVar3 + 4);
    if (pDVar2 != (gen->stack).stack[(gen->stack).sp + -1]) {
      (gen->gen).cubes.cube[*puVar3] = 1;
      (gen->stack).stack[(gen->stack).sp + -1] = pDVar2;
      while( true ) {
        while (next = (gen->stack).stack[(gen->stack).sp + -1],
              *(int *)((ulong)next & 0xfffffffffffffffe) != 0x7fffffff) {
          (gen->gen).cubes.cube[*(uint *)((ulong)next & 0xfffffffffffffffe)] = 0;
          (gen->stack).stack[(gen->stack).sp] =
               (DdNode *)(*(ulong *)(((ulong)next & 0xfffffffffffffffe) + 0x18) ^ 1);
          (gen->stack).sp = (gen->stack).sp + 1;
        }
        if ((DdNode *)((ulong)next & 0xfffffffffffffffe) != pDVar1->zero) break;
        while( true ) {
          if ((gen->stack).sp == 1) {
            gen->status = 0;
            (gen->stack).sp = (gen->stack).sp + -1;
            goto LAB_00c14b7d;
          }
          puVar3 = (uint *)((ulong)(gen->stack).stack[(gen->stack).sp + -2] & 0xfffffffffffffffe);
          pDVar2 = *(DdNode **)(puVar3 + 4);
          if (pDVar2 != next) break;
          (gen->gen).cubes.cube[*puVar3] = 2;
          (gen->stack).sp = (gen->stack).sp + -1;
          next = (gen->stack).stack[(gen->stack).sp + -1];
        }
        (gen->gen).cubes.cube[*puVar3] = 1;
        (gen->stack).stack[(gen->stack).sp + -1] = pDVar2;
      }
      gen->status = 1;
      (gen->gen).cubes.value = *(double *)(((ulong)next & 0xfffffffffffffffe) + 0x10);
      goto LAB_00c14b7d;
    }
    (gen->gen).cubes.cube[*puVar3] = 2;
    (gen->stack).sp = (gen->stack).sp + -1;
  } while( true );
}

Assistant:

int
Cudd_zddNextPath(
  DdGen * gen,
  int ** path)
{
    DdNode *top, *next, *prev;
    DdManager *zdd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
        next = cuddT(prev);
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[prev->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[prev->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *path = gen->gen.cubes.cube;
    return(1);

}